

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

void __thiscall QOpenGLTexture::borderColor(QOpenGLTexture *this,float *border)

{
  bool bVar1;
  const_reference pQVar2;
  long in_RSI;
  undefined4 uVar3;
  int i_1;
  int i;
  QOpenGLTexturePrivate *d;
  qsizetype in_stack_ffffffffffffffd8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe4;
  
  d_func((QOpenGLTexture *)0x1903fc);
  bVar1 = QList<QVariant>::isEmpty((QList<QVariant> *)0x190412);
  if (bVar1) {
    for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
      *(undefined4 *)(in_RSI + (long)iVar4 * 4) = 0;
    }
  }
  else {
    for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
      pQVar2 = QList<QVariant>::at((QList<QVariant> *)CONCAT44(in_stack_ffffffffffffffe4,iVar4),
                                   in_stack_ffffffffffffffd8);
      uVar3 = QVariant::toFloat((bool *)pQVar2);
      *(undefined4 *)(in_RSI + (long)iVar4 * 4) = uVar3;
    }
  }
  return;
}

Assistant:

void QOpenGLTexture::borderColor(float *border) const
{
    Q_D(const QOpenGLTexture);
    Q_ASSERT(border);
    if (d->borderColor.isEmpty()) {
        for (int i = 0; i < 4; ++i)
            border[i] = 0.0f;
    } else {
        for (int i = 0; i < 4; ++i)
            border[i] = d->borderColor.at(i).toFloat();
    }
}